

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::DecodePsbt(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::DecodePsbtResponseStruct_(const_cfd::js::api::DecodePsbtRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::DecodePsbtResponseStruct(cfd::js::api::DecodePsbtRequestStruct_const&)>::
  function<cfd::js::api::DecodePsbtResponseStruct(&)(cfd::js::api::DecodePsbtRequestStruct_const&),void>
            ((function<cfd::js::api::DecodePsbtResponseStruct(cfd::js::api::DecodePsbtRequestStruct_const&)>
              *)&local_38,PsbtStructApi::DecodePsbt);
  ExecuteJsonApi<cfd::js::api::json::DecodePsbtRequest,cfd::js::api::json::DecodePsbtResponse,cfd::js::api::DecodePsbtRequestStruct,cfd::js::api::DecodePsbtResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::DecodePsbtResponseStruct_(const_cfd::js::api::DecodePsbtRequestStruct_&)>::
  ~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::DecodePsbt(const std::string &request_message) {
  return ExecuteJsonApi<
      DecodePsbtRequest, DecodePsbtResponse, DecodePsbtRequestStruct,
      DecodePsbtResponseStruct>(request_message, PsbtStructApi::DecodePsbt);
}